

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
::_adjRemoveRefs(HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
                 *this,size_t level,
                Node<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
                *pNode)

{
  pointer pNVar1;
  pointer pNVar2;
  ulong uVar3;
  pointer pNVar4;
  ulong uVar5;
  size_t *psVar6;
  
  uVar5 = level << 4 | 8;
  do {
    pNVar1 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)pNVar2 - (long)pNVar1 >> 4;
    if ((uVar3 <= level) ||
       (pNVar4 = (pNode->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(pNode->_nodeRefs)._nodes.
                     super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 4) <=
       (pNode->_nodeRefs)._swapLevel)) goto LAB_00600763;
    *(long *)((long)&pNVar4->pNode + uVar5) =
         *(long *)((long)&pNVar1->pNode + uVar5) + *(long *)((long)&pNVar4->pNode + uVar5) + -1;
    SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
    ::swap(&pNode->_nodeRefs,&this->_nodeRefs);
    level = level + 1;
    uVar5 = uVar5 + 0x10;
  } while ((pNode->_nodeRefs)._swapLevel <
           (ulong)((long)(pNode->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pNode->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4));
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pNVar2 - (long)pNVar1 >> 4;
LAB_00600763:
  psVar6 = &pNVar1[level].width;
  for (; pNVar4 = pNVar2, level < uVar3; level = level + 1) {
    *psVar6 = *psVar6 - 1;
    psVar6 = psVar6 + 2;
  }
  while ((pNVar2 != pNVar1 &&
         (pNVar4[-1].pNode ==
          (Node<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
           *)0x0))) {
    pNVar2 = pNVar2 + -1;
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
    pNVar4 = pNVar4 + -1;
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::_adjRemoveRefs(size_t level,
                                           Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();

    // Swap all remaining levels
    // This assertion checks that if swapping can take place we must be at the
    // same level.
    assert(! thatRefs.canSwap() || level == thatRefs.swapLevel());
    while (level < _nodeRefs.height() && thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        // Compute the new width for the new node
        thatRefs[level].width += _nodeRefs[level].width - 1;
        thatRefs.swap(_nodeRefs);
        ++level;
        if (! thatRefs.canSwap()) {
            break;
        }
    }
    assert(! thatRefs.canSwap());
    // Decrement my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level++].width -= 1;
    }
    // Decrement my stack while top has a NULL pointer.
    while (_nodeRefs.height() && ! _nodeRefs[_nodeRefs.height() - 1].pNode) {
        _nodeRefs.pop_back();
    }
}